

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O0

char * google::protobuf::compiler::java::PrimitiveTypeName(JavaType type)

{
  LogMessage *other;
  LogFinisher local_5d [13];
  LogMessage local_50;
  JavaType local_14;
  char *pcStack_10;
  JavaType type_local;
  
  switch(type) {
  case JAVATYPE_INT:
    pcStack_10 = "int";
    break;
  case JAVATYPE_LONG:
    pcStack_10 = "long";
    break;
  case JAVATYPE_FLOAT:
    pcStack_10 = "float";
    break;
  case JAVATYPE_DOUBLE:
    pcStack_10 = "double";
    break;
  case JAVATYPE_BOOLEAN:
    pcStack_10 = "boolean";
    break;
  case JAVATYPE_STRING:
    pcStack_10 = "java.lang.String";
    break;
  case JAVATYPE_BYTES:
    pcStack_10 = "com.google.protobuf.ByteString";
    break;
  case JAVATYPE_ENUM:
    pcStack_10 = (char *)0x0;
    break;
  case JAVATYPE_MESSAGE:
    pcStack_10 = (char *)0x0;
    break;
  default:
    local_14 = type;
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_helpers.cc"
               ,0x155);
    other = internal::LogMessage::operator<<(&local_50,"Can\'t get here.");
    internal::LogFinisher::operator=(local_5d,other);
    internal::LogMessage::~LogMessage(&local_50);
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

const char* PrimitiveTypeName(JavaType type) {
  switch (type) {
    case JAVATYPE_INT    : return "int";
    case JAVATYPE_LONG   : return "long";
    case JAVATYPE_FLOAT  : return "float";
    case JAVATYPE_DOUBLE : return "double";
    case JAVATYPE_BOOLEAN: return "boolean";
    case JAVATYPE_STRING : return "java.lang.String";
    case JAVATYPE_BYTES  : return "com.google.protobuf.ByteString";
    case JAVATYPE_ENUM   : return NULL;
    case JAVATYPE_MESSAGE: return NULL;

    // No default because we want the compiler to complain if any new
    // JavaTypes are added.
  }

  GOOGLE_LOG(FATAL) << "Can't get here.";
  return NULL;
}